

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOWriteFmsMetaData(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsMetaData mdata)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *key_00;
  void *pvVar4;
  void *data;
  FmsInt size;
  FmsIntType int_type;
  FmsMetaDataType type;
  char *mdata_name;
  void *local_68;
  char *local_60;
  FmsMetaData *local_58;
  FmsMetaDataType local_4c;
  char *local_48 [3];
  
  iVar1 = FmsMetaDataGetType(mdata,&local_4c);
  if (1 < iVar1) {
    return 1;
  }
  if (iVar1 == 1) {
    return 0;
  }
  pcVar3 = join_keys(key,"MetaDataType");
  (*io->add_string)(ctx,pcVar3,FmsMetaDataTypeNames[local_4c]);
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  switch(local_4c) {
  case FMS_INTEGER:
    local_48[0] = (char *)0x0;
    local_68 = (void *)0x0;
    iVar1 = FmsMetaDataGetIntegers
                      (mdata,local_48,(FmsIntType *)&local_58,(FmsInt *)&local_60,&local_68);
    if (iVar1 != 0) {
      return 3;
    }
    pcVar3 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar3,local_48[0]);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    if (iVar1 != 0) {
      return 4;
    }
    pcVar3 = join_keys(key,"Data");
    iVar1 = (*io->add_typed_int_array)(ctx,pcVar3,(FmsScalarType)local_58,local_68,(FmsInt)local_60)
    ;
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    iVar2 = 5;
    break;
  case FMS_SCALAR:
    local_48[0] = (char *)0x0;
    local_68 = (void *)0x0;
    iVar1 = FmsMetaDataGetScalars
                      (mdata,local_48,(FmsScalarType *)&local_58,(FmsInt *)&local_60,&local_68);
    if (iVar1 != 0) {
      return 6;
    }
    pcVar3 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar3,local_48[0]);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    if (iVar1 != 0) {
      return 7;
    }
    pcVar3 = join_keys(key,"Data");
    iVar1 = (*io->add_scalar_array)(ctx,pcVar3,(FmsScalarType)local_58,local_68,(FmsInt)local_60);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    iVar2 = 8;
    break;
  case FMS_STRING:
    local_48[0] = (char *)0x0;
    local_60 = (char *)0x0;
    iVar1 = FmsMetaDataGetString(mdata,local_48,&local_60);
    if (iVar1 != 0) {
      return 9;
    }
    pcVar3 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar3,local_48[0]);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    if (iVar1 != 0) {
      return 10;
    }
    pcVar3 = join_keys(key,"Data");
    iVar1 = (*io->add_string)(ctx,pcVar3,local_60);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    iVar2 = 0xb;
    break;
  case FMS_META_DATA:
    local_60 = (char *)0x0;
    local_68 = (void *)0x0;
    local_58 = (FmsMetaData *)0x0;
    iVar1 = FmsMetaDataGetMetaData(mdata,&local_60,(FmsInt *)&local_68,&local_58);
    if (iVar1 != 0) {
      return 0xc;
    }
    if (local_58 == (FmsMetaData *)0x0) {
      return 0xd;
    }
    pcVar3 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar3,local_60);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    if (iVar1 != 0) {
      return 0xe;
    }
    pcVar3 = join_keys(key,"Size");
    iVar1 = (*io->add_int)(ctx,pcVar3,(FmsInt)local_68);
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    if (iVar1 != 0) {
      return 0xf;
    }
    pcVar3 = join_keys(key,"Data");
    if (local_68 != (void *)0x0) {
      pvVar4 = (void *)0x0;
      do {
        sprintf((char *)local_48,"%d",(ulong)pvVar4 & 0xffffffff);
        key_00 = join_keys(pcVar3,(char *)local_48);
        iVar1 = FmsIOWriteFmsMetaData(ctx,io,key_00,local_58[(long)pvVar4]);
        if (key_00 != (char *)0x0) {
          free(key_00);
        }
        if (iVar1 != 0) {
          if (pcVar3 != (char *)0x0) {
            free(pcVar3);
          }
          return 0x10;
        }
        pvVar4 = (void *)((long)pvVar4 + 1);
      } while (pvVar4 < local_68);
    }
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
    goto LAB_00110356;
  default:
    return 0x11;
  }
  if (iVar1 == 0) {
LAB_00110356:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
FmsIOWriteFmsMetaData(FmsIOContext *ctx, FmsIOFunctions *io, const char *key,
                      FmsMetaData mdata) {
  int err = 0;
  FmsMetaDataType type;

  /* It says it returns 1 if mdata is empty, but then just checks if its null (if im not mistaken).
      We already null checked before we got here so I'm not sure if we need to check for 1. */
  int r = FmsMetaDataGetType(mdata, &type);
  if(r > 1)
    E_RETURN(1);
  else if(r == 1)
    return 0;

  char *kmdtype = join_keys(key, "MetaDataType");
  (*io->add_string)(ctx, kmdtype, FmsMetaDataTypeNames[type]);
  FREE(kmdtype);

  switch(type) {
  case FMS_INTEGER: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsIntType int_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetIntegers(mdata, &mdata_name, &int_type, &size, &data))
      E_RETURN(3);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(4); }

    kdata = join_keys(key, "Data");
    err = (*io->add_typed_int_array)(ctx, kdata, int_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(5); }
    break;
  }
  case FMS_SCALAR: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsScalarType scalar_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetScalars(mdata, &mdata_name, &scalar_type, &size, &data))
      E_RETURN(6);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(7); }

    kdata = join_keys(key, "Data");
    err = (*io->add_scalar_array)(ctx, kdata, scalar_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(8); }
    break;
  }
  case FMS_STRING: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    const char *data = NULL;

    if(FmsMetaDataGetString(mdata, &mdata_name, &data))
      E_RETURN(9);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(10); }

    kdata = join_keys(key, "Data");
    err = (*io->add_string)(ctx, kdata, data);
    FREE(kdata);
    if (err) { E_RETURN(11); }
    break;
  }
  case FMS_META_DATA: {
    char *kname = NULL, *kdata = NULL, *ksize = NULL;
    const char *mdata_name = NULL;
    FmsInt i, size = 0;
    FmsMetaData *data = NULL;

    if(FmsMetaDataGetMetaData(mdata, &mdata_name, &size, &data))
      E_RETURN(12);

    if (!data) { E_RETURN(13); }

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(14); }

    ksize = join_keys(key, "Size");
    err = (*io->add_int)(ctx, ksize, size);
    FREE(ksize);
    if (err) { E_RETURN(15); }

    kdata = join_keys(key, "Data");
    // Recursive?
    for(i = 0; i < size; i++) {
      char temp[20], *tk = NULL;
      sprintf(temp, "%d", (int)i);
      tk = join_keys(kdata, temp);
      err = FmsIOWriteFmsMetaData(ctx, io, tk, data[i]);
      FREE(tk);
      if (err) {
        FREE(kdata);
        E_RETURN(16);
      }
    }
    FREE(kdata);
    break;
  }
  default:
    E_RETURN(17);
    break;
  }
  return 0;
}